

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool Json::converToUInt(char *str,unsigned_long *_ret)

{
  int *piVar1;
  ulong *in_RSI;
  char *in_RDI;
  char *endptr;
  unsigned_long val;
  char *local_28;
  ulong local_20;
  ulong *local_18;
  char *local_10;
  
  local_28 = (char *)0x0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  piVar1 = __errno_location();
  *piVar1 = 0;
  local_20 = strtoul(local_10,&local_28,0);
  piVar1 = __errno_location();
  if (((*piVar1 != 0x22) || (local_20 != 0xffffffffffffffff)) &&
     ((piVar1 = __errno_location(), *piVar1 == 0 || (local_20 != 0)))) {
    if (local_10 == local_28) {
      return false;
    }
    if (local_18 != (ulong *)0x0) {
      *local_18 = local_20;
    }
    return true;
  }
  return false;
}

Assistant:

static bool
converToUInt (const char *str, unsigned long int *_ret)
{
  unsigned long int val;
  char *endptr = NULL;

  errno = 0; /* To distinguish success/failure after call */
  val = strtoul(str, &endptr, 0);

  if ((errno == ERANGE && val == ULONG_MAX) || (errno != 0 && val == 0)) {
    return false;
  }

  if (str == endptr) {
    /* Nothing parsed from the string */
    return false;
  }

  if (_ret != NULL) {
    *_ret = val;
  }

  return true;
}